

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool __thiscall QDir::cd(QDir *this,QString *dirName)

{
  long lVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  qsizetype qVar6;
  QDirPrivate *pQVar7;
  QFileSystemEntry *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView rhs;
  QStringView lhs;
  QFileInfo local_70;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (dirName->d).size;
  bVar5 = true;
  if ((lVar1 == 0) || ((pQVar7 = (this->d_ptr).d.ptr, lVar1 == 1 && (*(dirName->d).ptr == L'.'))))
  goto LAB_00225ea2;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  bVar5 = isRelativePath(dirName);
  if (bVar5) {
    this_00 = &pQVar7->dirEntry;
    QFileSystemEntry::filePath(&local_68,this_00);
    pcVar4 = local_48.d.ptr;
    pDVar3 = local_48.d.d;
    qVar6 = local_68.d.size;
    pDVar2 = local_68.d.d;
    local_68.d.d = local_48.d.d;
    local_48.d.d = pDVar2;
    local_48.d.ptr = local_68.d.ptr;
    local_68.d.ptr = pcVar4;
    local_68.d.size = local_48.d.size;
    local_48.d.size = qVar6;
    if ((QDirPrivate *)pDVar3 != (QDirPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    bVar5 = QString::endsWith(&local_48,(QChar)0x2f,CaseSensitive);
    if (!bVar5) {
      QString::append(&local_48,(QChar)0x2f);
    }
    QString::append(&local_48,dirName);
    qVar6 = QString::indexOf(dirName,(QChar)0x2f,0,CaseSensitive);
    if ((qVar6 < 0) &&
       (((dirName->d).size != 2 ||
        (rhs.m_data = "..", rhs.m_size = 2, lhs.m_data = (dirName->d).ptr, lhs.m_size = 2,
        bVar5 = QtPrivate::equalStrings(lhs,rhs), !bVar5)))) {
      QFileSystemEntry::filePath(&local_68,this_00);
      if (local_68.d.size == 1) {
        bVar5 = *local_68.d.ptr == L'.';
      }
      else {
        bVar5 = false;
      }
      if ((QDirPrivate *)local_68.d.d != (QDirPrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (!bVar5) goto LAB_00225e23;
    }
    bVar5 = qt_cleanPath(&local_48);
    if (bVar5) {
      s.m_data = "..";
      s.m_size = 2;
      bVar5 = QString::startsWith(&local_48,s,CaseSensitive);
      if (bVar5) {
        QFileInfo::QFileInfo(&local_70,&local_48);
        QFileInfo::absoluteFilePath(&local_68,&local_70);
        pcVar4 = local_48.d.ptr;
        pDVar3 = local_48.d.d;
        qVar6 = local_68.d.size;
        pDVar2 = local_68.d.d;
        local_68.d.d = local_48.d.d;
        local_48.d.d = pDVar2;
        local_48.d.ptr = local_68.d.ptr;
        local_68.d.ptr = pcVar4;
        local_68.d.size = local_48.d.size;
        local_48.d.size = qVar6;
        if ((QDirPrivate *)pDVar3 != (QDirPrivate *)0x0) {
          LOCK();
          (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        QFileInfo::~QFileInfo(&local_70);
      }
      goto LAB_00225e23;
    }
    bVar5 = false;
  }
  else {
    QString::operator=(&local_48,dirName);
    qt_cleanPath(&local_48);
LAB_00225e23:
    pQVar7 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar7,(this->d_ptr).d.ptr);
    local_68.d.d = (Data *)pQVar7;
    QDirPrivate::setPath(pQVar7,&local_48);
    bVar5 = QDirPrivate::exists(pQVar7);
    pDVar2 = local_68.d.d;
    if (bVar5) {
      local_68.d.d = (Data *)0x0;
      QSharedDataPointer<QDirPrivate>::reset(&this->d_ptr,(QDirPrivate *)pDVar2);
    }
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_68);
  }
  if ((QDirPrivate *)local_48.d.d != (QDirPrivate *)0x0) {
    LOCK();
    (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00225ea2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QDir::cd(const QString &dirName)
{
    // Don't detach just yet.
    const QDirPrivate * const d = d_ptr.constData();

    if (dirName.isEmpty() || dirName == u'.')
        return true;
    QString newPath;
    if (isAbsolutePath(dirName)) {
        newPath = dirName;
        qt_cleanPath(&newPath);
    } else {
        newPath = d->dirEntry.filePath();
        if (!newPath.endsWith(u'/'))
            newPath += u'/';
        newPath += dirName;
        if (dirName.indexOf(u'/') >= 0
            || dirName == ".."_L1
            || d->dirEntry.filePath() == u'.') {
            if (!qt_cleanPath(&newPath))
                return false;
            /*
              If newPath starts with .., we convert it to absolute to
              avoid infinite looping on

                  QDir dir(".");
                  while (dir.cdUp())
                      ;
            */
            if (newPath.startsWith(".."_L1)) {
                newPath = QFileInfo(newPath).absoluteFilePath();
            }
        }
    }

    std::unique_ptr<QDirPrivate> dir(new QDirPrivate(*d_ptr.constData()));
    dir->setPath(newPath);
    if (!dir->exists())
        return false;

    d_ptr = dir.release();
    return true;
}